

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::CreateContext::exec(CreateContext *this,Thread *t)

{
  EGLDisplay pvVar1;
  _func_int **pp_Var2;
  EGLConfig pvVar3;
  bool bVar4;
  deUint32 dVar5;
  deBool dVar6;
  GLES2Context *pGVar7;
  MessageBuilder *pMVar8;
  EGLContext pvVar9;
  TestError *this_00;
  MessageBuilder local_9a0;
  MessageBuilder local_810;
  MessageBuilder local_680;
  MessageBuilder local_4f0;
  MessageBuilder local_360;
  MessageBuilder local_1c0;
  undefined8 local_30;
  EGLint attriblist [3];
  EGLThread *thread;
  Thread *t_local;
  CreateContext *this_local;
  
  register0x00000000 =
       (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (register0x00000000 == (Thread *)0x0) {
    __cxa_bad_cast();
  }
  pvVar1 = this->m_display;
  pGVar7 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_context);
  pGVar7->display = pvVar1;
  local_30 = 0x200003098;
  attriblist[0] = 0x3038;
  tcu::ThreadUtil::Thread::newMessage(&local_1c0,stack0xffffffffffffffe0);
  pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_1c0,(char (*) [39])"Begin -- eglBindAPI(EGL_OPENGL_ES_API)");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1c0);
  do {
    pp_Var2 = stack0xffffffffffffffe0[1].super_Thread._vptr_Thread;
    (**(code **)*pp_Var2)(pp_Var2,0x30a0);
    dVar5 = (**(code **)(*stack0xffffffffffffffe0[1].super_Thread._vptr_Thread + 0xf8))();
    eglu::checkError(dVar5,"bindAPI(EGL_OPENGL_ES_API)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                     ,0x261);
    dVar6 = ::deGetFalse();
  } while (dVar6 != 0);
  tcu::ThreadUtil::Thread::newMessage(&local_360,stack0xffffffffffffffe0);
  pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<
                     (&local_360,(char (*) [20])"End -- eglBindAPI()");
  tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,(EndToken *)&tcu::ThreadUtil::Message::End);
  tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_360);
  bVar4 = de::SharedPtr::operator_cast_to_bool((SharedPtr *)&this->m_shared);
  if (bVar4) {
    tcu::ThreadUtil::Thread::newMessage(&local_4f0,stack0xffffffffffffffe0);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (&local_4f0,(char (*) [27])"Begin -- eglCreateContext(");
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,&this->m_display);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,&this->m_config);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
    pGVar7 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_shared);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,&pGVar7->context);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,(char (*) [47])0x2b3cb9a);
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_4f0);
    pp_Var2 = stack0xffffffffffffffe0[1].super_Thread._vptr_Thread;
    pvVar1 = this->m_display;
    pvVar3 = this->m_config;
    pGVar7 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_shared);
    pvVar9 = (EGLContext)
             (**(code **)(*pp_Var2 + 0x30))(pp_Var2,pvVar1,pvVar3,pGVar7->context,&local_30);
    pGVar7 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_context);
    pGVar7->context = pvVar9;
    tcu::ThreadUtil::Thread::newMessage(&local_680,stack0xffffffffffffffe0);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<(&local_680,(char (*) [8])"End -- ");
    pGVar7 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_context);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,&pGVar7->context);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (pMVar8,(char (*) [22])" = eglCreateContext()");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_680);
  }
  else {
    tcu::ThreadUtil::Thread::newMessage(&local_810,stack0xffffffffffffffe0);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (&local_810,(char (*) [27])"Begin -- eglCreateContext(");
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,&this->m_display);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,&this->m_config);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (pMVar8,(char (*) [63])
                               ", EGL_NO_CONTEXT, { EGL_CONTEXT_CLIENT_VERSION, 2, EGL_NONE })");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_810);
    pp_Var2 = stack0xffffffffffffffe0[1].super_Thread._vptr_Thread;
    pvVar9 = (EGLContext)
             (**(code **)(*pp_Var2 + 0x30))(pp_Var2,this->m_display,this->m_config,0,&local_30);
    pGVar7 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_context);
    pGVar7->context = pvVar9;
    tcu::ThreadUtil::Thread::newMessage(&local_9a0,stack0xffffffffffffffe0);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<(&local_9a0,(char (*) [8])"End -- ");
    pGVar7 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_context);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,&pGVar7->context);
    pMVar8 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (pMVar8,(char (*) [22])" = eglCreateContext()");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar8,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_9a0);
  }
  dVar5 = (**(code **)(*stack0xffffffffffffffe0[1].super_Thread._vptr_Thread + 0xf8))();
  eglu::checkError(dVar5,"Failed to create GLES2 context",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                   ,0x275);
  while( true ) {
    dVar6 = ::deGetFalse();
    if (dVar6 != 0) break;
    pGVar7 = de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator->(&this->m_context);
    if (pGVar7->context == (EGLContext)0x0) break;
    dVar6 = ::deGetFalse();
    if (dVar6 == 0) {
      return;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"m_context->context != EGL_NO_CONTEXT",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
             ,0x276);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void CreateContext::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	m_context->display = m_display;

	const EGLint attriblist[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	thread.newMessage() << "Begin -- eglBindAPI(EGL_OPENGL_ES_API)" << tcu::ThreadUtil::Message::End;
	EGLU_CHECK_CALL(thread.egl, bindAPI(EGL_OPENGL_ES_API));
	thread.newMessage() << "End -- eglBindAPI()" << tcu::ThreadUtil::Message::End;

	if (m_shared)
	{
		DE_ASSERT(m_shared->context != EGL_NO_CONTEXT);
		DE_ASSERT(m_shared->display != EGL_NO_DISPLAY);
		DE_ASSERT(m_shared->display == m_display);

		thread.newMessage() << "Begin -- eglCreateContext(" << m_display << ", " << m_config << ", " << m_shared->context << ", { EGL_CONTEXT_CLIENT_VERSION, 2, EGL_NONE })" << tcu::ThreadUtil::Message::End;
		m_context->context = thread.egl.createContext(m_display, m_config, m_shared->context, attriblist);
		thread.newMessage() << "End -- " << m_context->context << " = eglCreateContext()" << tcu::ThreadUtil::Message::End;
	}
	else
	{
		thread.newMessage() << "Begin -- eglCreateContext(" << m_display << ", " << m_config << ", EGL_NO_CONTEXT, { EGL_CONTEXT_CLIENT_VERSION, 2, EGL_NONE })" << tcu::ThreadUtil::Message::End;
		m_context->context = thread.egl.createContext(m_display, m_config, EGL_NO_CONTEXT, attriblist);
		thread.newMessage() << "End -- " << m_context->context << " = eglCreateContext()" << tcu::ThreadUtil::Message::End;
	}

	EGLU_CHECK_MSG(thread.egl, "Failed to create GLES2 context");
	TCU_CHECK(m_context->context != EGL_NO_CONTEXT);
}